

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O3

void __thiscall ProblemTest_Complementarity_Test::TestBody(ProblemTest_Complementarity_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  string gtest_expected_message;
  Problem p;
  AssertHelper local_3b8;
  AssertionResult local_3b0;
  string local_3a0;
  AssertHelper local_380;
  BasicProblem<mp::BasicProblemParams<int>_> local_378;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_378);
  local_3b0.success_ =
       local_378.compl_vars_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_start ==
       local_378.compl_vars_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_3b0.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!local_3b0.success_) {
    testing::Message::Message((Message *)&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a0,(internal *)&local_3b0,(AssertionResult *)"p.HasComplementarity()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x23d,local_3a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if (((local_3b8.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_3b8.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_3b8.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar(&local_378,0.0,1.0,CONTINUOUS);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(&local_378,0.0,1.0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity(&local_378,0,0,(ComplInfo)0x0);
  local_3b0.success_ =
       local_378.compl_vars_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_start !=
       local_378.compl_vars_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_3b0.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (local_378.compl_vars_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_378.compl_vars_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    testing::Message::Message((Message *)&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a0,(internal *)&local_3b0,(AssertionResult *)"p.HasComplementarity()","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x242,local_3a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if (((local_3b8.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_3b8.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_3b8.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_3b0.success_ == true) {
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"invalid index","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity
                (&local_378,-1,0,(ComplInfo)0x0);
    }
    testing::AssertionResult::operator<<
              (&local_3b0,
               (char (*) [127])
               "Expected: p.SetComplementarity(-1, 0, ComplInfo(0)) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_3a0);
  if (local_3b0.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_3b0.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x243,pcVar2);
  testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
  testing::internal::AssertHelper::~AssertHelper(&local_3b8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_3a0._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_3b0.success_ == true) {
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"invalid index","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity
                (&local_378,1,0,(ComplInfo)0x0);
    }
    testing::AssertionResult::operator<<
              (&local_3b0,
               (char (*) [126])
               "Expected: p.SetComplementarity(1, 0, ComplInfo(0)) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_3a0);
  if (local_3b0.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_3b0.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x244,pcVar2);
  testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
  testing::internal::AssertHelper::~AssertHelper(&local_3b8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_3a0._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_3b0.success_ == true) {
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"invalid index","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity
                (&local_378,0,-1,(ComplInfo)0x0);
    }
    testing::AssertionResult::operator<<
              (&local_3b0,
               (char (*) [127])
               "Expected: p.SetComplementarity(0, -1, ComplInfo(0)) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_3a0);
  if (local_3b0.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_3b0.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x245,pcVar2);
  testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
  testing::internal::AssertHelper::~AssertHelper(&local_3b8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_3a0._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_3b0.success_ == true) {
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"invalid index","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity
                (&local_378,0,1,(ComplInfo)0x0);
    }
    testing::AssertionResult::operator<<
              (&local_3b0,
               (char (*) [126])
               "Expected: p.SetComplementarity(0, 1, ComplInfo(0)) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_3a0);
  if (local_3b0.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_3b0.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x246,pcVar2);
  testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
  testing::internal::AssertHelper::~AssertHelper(&local_3b8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_3a0._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_378);
  return;
}

Assistant:

TEST(ProblemTest, Complementarity) {
  Problem p;
  EXPECT_FALSE(p.HasComplementarity());
  p.AddVar(0, 1);
  p.AddCon(0, 1);
  using mp::ComplInfo;
  p.SetComplementarity(0, 0, ComplInfo(0));
  EXPECT_TRUE(p.HasComplementarity());
  EXPECT_ASSERT(p.SetComplementarity(-1, 0, ComplInfo(0)), "invalid index");
  EXPECT_ASSERT(p.SetComplementarity(1, 0, ComplInfo(0)), "invalid index");
  EXPECT_ASSERT(p.SetComplementarity(0, -1, ComplInfo(0)), "invalid index");
  EXPECT_ASSERT(p.SetComplementarity(0, 1, ComplInfo(0)), "invalid index");
}